

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

stb_dirtree2 * stb_dirtree2_from_files_relative(char *src,char **filelist,int count)

{
  char *pcVar1;
  stb_dirtree2 **ppsVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  stb_dirtree2 *p;
  char *pcVar7;
  stb_dirtree2 *psVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  char **filelist_00;
  ulong uVar14;
  char **files;
  char **descendents;
  char buffer1 [1024];
  char buffer2 [1024];
  char **local_850;
  char **local_848;
  char **local_840;
  char local_838 [1023];
  char acStack_439 [1033];
  
  sVar5 = strlen(src);
  p = (stb_dirtree2 *)0x0;
  local_848 = (char **)0x0;
  local_850 = (char **)0x0;
  if (count != 0) {
    if (0 < count) {
      uVar14 = 0;
      do {
        pcVar13 = filelist[uVar14];
        iVar4 = stb_dir_is_prefix(src,(int)sVar5,pcVar13);
        if (iVar4 != 0) {
          if (local_848 == (char **)0x0) {
            iVar9 = 1;
            iVar4 = 0;
          }
          else {
            iVar9 = *(int *)(local_848 + -2) + 1;
            iVar4 = *(int *)((long)local_848 + -0xc);
          }
          if (iVar4 < iVar9) {
            stb__arr_addlen_(&local_848,8,1);
          }
          else {
            *(int *)(local_848 + -2) = *(int *)(local_848 + -2) + 1;
          }
          if (local_848 == (char **)0x0) {
            lVar11 = 0;
          }
          else {
            lVar11 = (long)*(int *)(local_848 + -2);
          }
          local_848[lVar11 + -1] = pcVar13;
        }
        uVar14 = uVar14 + 1;
      } while ((uint)count != uVar14);
    }
    if (local_848 == (char **)0x0) {
      p = (stb_dirtree2 *)0x0;
    }
    else {
      if ((int)sVar5 == 0) {
        uVar14 = (ulong)(**local_848 == '\\' || **local_848 == '/');
      }
      else {
        uVar14 = (long)((sVar5 << 0x20) + 0x100000000) >> 0x20;
      }
      filelist_00 = local_848;
      if (0 < *(int *)(local_848 + -2)) {
        iVar4 = 0;
        local_840 = local_848;
        do {
          pcVar13 = filelist_00[iVar4];
          cVar3 = pcVar13[uVar14];
          if (cVar3 != '\0') {
            pcVar6 = pcVar13 + uVar14 + 1;
            do {
              if ((cVar3 == '/') || (cVar3 == '\\')) {
                iVar4 = iVar4 + 1;
                goto LAB_001883e6;
              }
              cVar3 = *pcVar6;
              pcVar6 = pcVar6 + 1;
            } while (cVar3 != '\0');
          }
          if (local_850 == (char **)0x0) {
            iVar10 = 1;
            iVar9 = 0;
          }
          else {
            iVar10 = *(int *)(local_850 + -2) + 1;
            iVar9 = *(int *)((long)local_850 + -0xc);
          }
          if (iVar9 < iVar10) {
            stb__arr_addlen_(&local_850,8,1);
            filelist_00 = local_840;
          }
          else {
            *(int *)(local_850 + -2) = *(int *)(local_850 + -2) + 1;
          }
          if (local_850 == (char **)0x0) {
            lVar11 = 0;
          }
          else {
            lVar11 = (long)*(int *)(local_850 + -2);
          }
          local_850[lVar11 + -1] = pcVar13;
          iVar9 = *(int *)(filelist_00 + -2);
          filelist_00[iVar4] = filelist_00[(long)iVar9 + -1];
          *(int *)(filelist_00 + -2) = iVar9 + -1;
LAB_001883e6:
        } while (iVar4 < *(int *)(filelist_00 + -2));
      }
      p = (stb_dirtree2 *)malloc(0x28);
      p->files = local_850;
      p->subdirs = (stb_dirtree2 **)0x0;
      pcVar7 = strdup(src);
      p->fullpath = pcVar7;
      pcVar6 = (char *)0x0;
      cVar3 = *pcVar7;
      pcVar13 = pcVar7;
      while (cVar3 != '\0') {
        if (cVar3 == '\\') {
          pcVar6 = pcVar13;
        }
        if (cVar3 == '/') {
          pcVar6 = pcVar13;
        }
        pcVar1 = pcVar13 + 1;
        pcVar13 = pcVar13 + 1;
        cVar3 = *pcVar1;
      }
      pcVar13 = pcVar6 + 1;
      if (pcVar6 == (char *)0x0) {
        pcVar13 = pcVar7;
      }
      p->relpath = pcVar13;
      stb__strcmpoffset = 0;
      qsort(filelist_00,(long)*(int *)(filelist_00 + -2),8,stb__qsort_stricmp);
      local_838[0] = '\0';
      if (0 < *(int *)(filelist_00 + -2)) {
        lVar11 = 0;
        pcVar13 = acStack_439 + 1;
        do {
          pcVar6 = filelist_00[lVar11];
          cVar3 = pcVar6[uVar14];
          if (cVar3 != '\0') {
            pcVar7 = pcVar6 + uVar14;
            do {
              if ((cVar3 == '/') || (cVar3 == '\\')) goto LAB_001884af;
              cVar3 = pcVar7[1];
              pcVar7 = pcVar7 + 1;
            } while (cVar3 != '\0');
          }
          pcVar7 = (char *)0x0;
LAB_001884af:
          if (pcVar7 == (char *)0x0) {
            __assert_fail("t",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0x1820,
                          "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)");
          }
          sVar5 = (long)(((ulong)(uint)((int)pcVar7 - (int)pcVar6) << 0x20) + 0x100000000) >> 0x20;
          strncpy(pcVar13,pcVar6,sVar5);
          acStack_439[sVar5] = '\0';
          iVar4 = strcasecmp(local_838,pcVar13);
          if (iVar4 != 0) {
            psVar8 = stb_dirtree2_from_files_relative
                               (pcVar13,filelist_00,*(int *)(filelist_00 + -2));
            if (psVar8 == (stb_dirtree2 *)0x0) {
              __assert_fail("t != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0x1824,
                            "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)");
            }
            strcpy(local_838,pcVar13);
            ppsVar2 = p->subdirs;
            if (ppsVar2 == (stb_dirtree2 **)0x0) {
              iVar9 = 1;
              iVar4 = 0;
            }
            else {
              iVar9 = *(int *)(ppsVar2 + -2) + 1;
              iVar4 = *(int *)((long)ppsVar2 + -0xc);
            }
            if (iVar4 < iVar9) {
              stb__arr_addlen_((void **)p,8,1);
            }
            else {
              *(int *)(ppsVar2 + -2) = *(int *)(ppsVar2 + -2) + 1;
            }
            ppsVar2 = p->subdirs;
            if (ppsVar2 == (stb_dirtree2 **)0x0) {
              lVar12 = 0;
            }
            else {
              lVar12 = (long)*(int *)(ppsVar2 + -2);
            }
            ppsVar2[lVar12 + -1] = psVar8;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)(filelist_00 + -2));
      }
      if (p->subdirs == (stb_dirtree2 **)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *(int *)(p->subdirs + -2);
      }
      p->num_subdir = iVar4;
      p->weight = 0.0;
    }
  }
  return p;
}

Assistant:

stb_dirtree2 *stb_dirtree2_from_files_relative(char *src, char **filelist, int count)
{
   char buffer1[1024];
   int i;
   int dlen = strlen(src), elen;
   stb_dirtree2 *d;
   char ** descendents = NULL;
   char ** files = NULL;
   char *s;
   if (!count) return NULL;
   // first find all the ones that belong here... note this is will take O(NM) with N files and M subdirs
   for (i=0; i < count; ++i) {
      if (stb_dir_is_prefix(src, dlen, filelist[i])) {
         stb_arr_push(descendents, filelist[i]);
      }
   }
   if (descendents == NULL)
      return NULL;
   elen = dlen;
   // skip a leading slash
   if (elen == 0 && (descendents[0][0] == '/' || descendents[0][0] == '\\'))
      ++elen;
   else if (elen)
      ++elen;
   // now extract all the ones that have their root here
   for (i=0; i < stb_arr_len(descendents);) {
      if (!stb_strchr2(descendents[i]+elen, '/', '\\')) {
         stb_arr_push(files, descendents[i]);
         descendents[i] = descendents[stb_arr_len(descendents)-1];
         stb_arr_pop(descendents);
      } else
         ++i;
   }
   // now create a record
   d = (stb_dirtree2 *) malloc(sizeof(*d));
   d->files = files;
   d->subdirs = NULL;
   d->fullpath = strdup(src);
   s = stb_strrchr2(d->fullpath, '/', '\\');
   if (s)
      ++s;
   else
      s = d->fullpath;
   d->relpath = s;
   // now create the children
   qsort(descendents, stb_arr_len(descendents), sizeof(char *), stb_qsort_stricmp(0));
   buffer1[0] = 0;
   for (i=0; i < stb_arr_len(descendents); ++i) {
      char buffer2[1024];
      char *s = descendents[i] + elen, *t;
      t = stb_strchr2(s, '/', '\\');
      assert(t);
      stb_strncpy(buffer2, descendents[i], t-descendents[i]+1);
      if (stb_stricmp(buffer1, buffer2)) {
         stb_dirtree2 *t = stb_dirtree2_from_files_relative(buffer2, descendents, stb_arr_len(descendents));
         assert(t != NULL);
         strcpy(buffer1, buffer2);
         stb_arr_push(d->subdirs, t);
      }
   }
   d->num_subdir = stb_arr_len(d->subdirs);
   d->weight = 0;
   return d;
}